

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O3

void Llb_MnxStop(Llb_Mnx_t *p)

{
  long lVar1;
  Vec_Ptr_t *pVVar2;
  int level;
  DdManager *dd;
  Vec_Ptr_t *pVVar3;
  Vec_Int_t *pVVar4;
  double dVar5;
  double dVar6;
  
  if (p->pPars->fVerbose != 0) {
    dd = p->dd;
    lVar1 = Cudd_ReadReorderingTime(dd);
    p->timeReo = lVar1;
    p->timeOther = p->timeTotal - (p->timeImage + p->timeRemap);
    level = (int)dd;
    Abc_Print(level,"%s =","Image    ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeImage * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeImage / 1000000.0,dVar5);
    Abc_Print(level,"%s =","Remap    ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeRemap * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeRemap / 1000000.0,dVar5);
    Abc_Print(level,"%s =","Other    ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeOther / 1000000.0,dVar5);
    Abc_Print(level,"%s =","TOTAL    ");
    dVar6 = (double)p->timeTotal;
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = (dVar6 * 100.0) / dVar6;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar6 / 1000000.0,dVar5);
    Abc_Print(level,"%s =","  reo    ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeReo * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeReo / 1000000.0,dVar5);
  }
  if (p->bBad != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->dd,p->bBad);
  }
  if (p->bReached != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->dd,p->bReached);
  }
  if (p->bCurrent != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->dd,p->bCurrent);
  }
  if (p->bNext != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->dd,p->bNext);
  }
  pVVar3 = p->vRings;
  if (pVVar3 == (Vec_Ptr_t *)0x0) {
    pVVar3 = (Vec_Ptr_t *)0x0;
  }
  else if (0 < pVVar3->nSize) {
    lVar1 = 0;
    do {
      Cudd_RecursiveDeref(p->dd,(DdNode *)pVVar3->pArray[lVar1]);
      lVar1 = lVar1 + 1;
      pVVar3 = p->vRings;
    } while (lVar1 < pVVar3->nSize);
  }
  pVVar2 = p->vRoots;
  if ((pVVar2 != (Vec_Ptr_t *)0x0) && (0 < pVVar2->nSize)) {
    lVar1 = 0;
    do {
      Cudd_RecursiveDeref(p->dd,(DdNode *)pVVar2->pArray[lVar1]);
      lVar1 = lVar1 + 1;
      pVVar2 = p->vRoots;
    } while (lVar1 < pVVar2->nSize);
    pVVar3 = p->vRings;
  }
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
      p->vRings->pArray = (void **)0x0;
      pVVar3 = p->vRings;
      if (pVVar3 == (Vec_Ptr_t *)0x0) goto LAB_007e844b;
    }
    free(pVVar3);
    p->vRings = (Vec_Ptr_t *)0x0;
  }
LAB_007e844b:
  pVVar3 = p->vRoots;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
      p->vRoots->pArray = (void **)0x0;
      pVVar3 = p->vRoots;
      if (pVVar3 == (Vec_Ptr_t *)0x0) goto LAB_007e8487;
    }
    free(pVVar3);
    p->vRoots = (Vec_Ptr_t *)0x0;
  }
LAB_007e8487:
  Extra_StopManager(p->dd);
  pVVar4 = p->vOrder;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      p->vOrder->pArray = (int *)0x0;
      pVVar4 = p->vOrder;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_007e84cc;
    }
    free(pVVar4);
    p->vOrder = (Vec_Int_t *)0x0;
  }
LAB_007e84cc:
  pVVar4 = p->vVars2Q;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      p->vVars2Q->pArray = (int *)0x0;
      pVVar4 = p->vVars2Q;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_007e8500;
    }
    free(pVVar4);
  }
LAB_007e8500:
  free(p);
  return;
}

Assistant:

void Llb_MnxStop( Llb_Mnx_t * p )
{
    DdNode * bTemp;
    int i;
    if ( p->pPars->fVerbose ) 
    {
        p->timeReo = Cudd_ReadReorderingTime(p->dd);
        p->timeOther = p->timeTotal - p->timeImage - p->timeRemap;
        ABC_PRTP( "Image    ", p->timeImage, p->timeTotal );
        ABC_PRTP( "Remap    ", p->timeRemap, p->timeTotal );
        ABC_PRTP( "Other    ", p->timeOther, p->timeTotal );
        ABC_PRTP( "TOTAL    ", p->timeTotal, p->timeTotal );
        ABC_PRTP( "  reo    ", p->timeReo,   p->timeTotal );
    }
    // remove BDDs
    if ( p->bBad )
        Cudd_RecursiveDeref( p->dd, p->bBad );
    if ( p->bReached )
        Cudd_RecursiveDeref( p->dd, p->bReached );
    if ( p->bCurrent )
        Cudd_RecursiveDeref( p->dd, p->bCurrent );
    if ( p->bNext )
        Cudd_RecursiveDeref( p->dd, p->bNext );
	if ( p->vRings )
    Vec_PtrForEachEntry( DdNode *, p->vRings, bTemp, i )
        Cudd_RecursiveDeref( p->dd, bTemp );
	if ( p->vRoots )
    Vec_PtrForEachEntry( DdNode *, p->vRoots, bTemp, i )
        Cudd_RecursiveDeref( p->dd, bTemp );
    // remove arrays
    Vec_PtrFreeP( &p->vRings );
    Vec_PtrFreeP( &p->vRoots );
//Cudd_PrintInfo( p->dd, stdout );
    Extra_StopManager( p->dd );
    Vec_IntFreeP( &p->vOrder );
    Vec_IntFreeP( &p->vVars2Q );
    ABC_FREE( p );
}